

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void logFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  iVar1 = sqlite3_value_numeric_type(*argv);
  if (iVar1 - 1U < 2) {
    dVar2 = sqlite3VdbeRealValue(*argv);
    if (0.0 < dVar2) {
      if (argc != 2) {
        iVar1 = *(int *)&context->pFunc->pUserData;
        if (iVar1 == 2) {
          dVar2 = log2(dVar2);
        }
        else if (iVar1 == 1) {
          dVar2 = log10(dVar2);
        }
        else {
          dVar2 = log(dVar2);
        }
LAB_0019c519:
        sqlite3_result_double(context,dVar2);
        return;
      }
      iVar1 = sqlite3_value_numeric_type(*argv);
      if (iVar1 - 1U < 2) {
        dVar3 = log(dVar2);
        if (0.0 < dVar3) {
          dVar2 = sqlite3VdbeRealValue(argv[1]);
          if (0.0 < dVar2) {
            dVar2 = log(dVar2);
            dVar2 = dVar2 / dVar3;
            goto LAB_0019c519;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void logFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  double x, b, ans;
  assert( argc==1 || argc==2 );
  switch( sqlite3_value_numeric_type(argv[0]) ){
    case SQLITE_INTEGER:
    case SQLITE_FLOAT:
      x = sqlite3_value_double(argv[0]);
      if( x<=0.0 ) return;
      break;
    default:
      return;
  }
  if( argc==2 ){
    switch( sqlite3_value_numeric_type(argv[0]) ){
      case SQLITE_INTEGER:
      case SQLITE_FLOAT:
        b = log(x);
        if( b<=0.0 ) return;
        x = sqlite3_value_double(argv[1]);
        if( x<=0.0 ) return;
        break;
     default:
        return;
    }
    ans = log(x)/b;
  }else{
    switch( SQLITE_PTR_TO_INT(sqlite3_user_data(context)) ){
      case 1:
        ans = log10(x);
        break;
      case 2:
        ans = log2(x);
        break;
      default:
        ans = log(x);
        break;
    }
  }
  sqlite3_result_double(context, ans);
}